

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthSpecsOf.hpp
# Opt level: O2

string * __thiscall
sciplot::DepthSpecsOf<sciplot::BorderSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,DepthSpecsOf<sciplot::BorderSpecs> *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_depth);
  return __return_storage_ptr__;
}

Assistant:

auto DepthSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    return m_depth;
}